

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O3

Gia_Man_t * Gia_MiniAigMiter(Mini_Aig_t *p,int *pEquivs)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Gia_Man_t *p_00;
  char *pcVar8;
  Vec_Int_t *p_01;
  int *piVar9;
  Gia_Obj_t *pGVar10;
  Gia_Man_t *pGVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  
  iVar7 = p->nSize;
  uVar14 = iVar7 / 2;
  p_00 = Gia_ManStart(iVar7 - (iVar7 >> 0x1f) & 0xfffffffe);
  pcVar8 = (char *)malloc(8);
  builtin_strncpy(pcVar8,"MiniAig",8);
  p_00->pName = pcVar8;
  p_01 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar14 - 1) {
    uVar3 = uVar14;
  }
  p_01->nSize = 0;
  p_01->nCap = uVar3;
  iVar5 = 0;
  if (uVar3 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)(int)uVar3 << 2);
  }
  p_01->pArray = piVar9;
  Vec_IntPush(p_01,0);
  Gia_ManHashAlloc(p_00);
  if (3 < iVar7) {
    uVar3 = 2;
    if (2 < (int)uVar14) {
      uVar3 = uVar14;
    }
    uVar12 = 1;
    iVar5 = 0;
    do {
      iVar4 = Mini_AigNodeIsPi(p,uVar12);
      if (iVar4 == 0) {
        iVar4 = Mini_AigNodeIsPo(p,uVar12);
        if (iVar4 == 0) {
          pGVar11 = (Gia_Man_t *)p;
          iVar4 = Mini_AigNodeIsAnd(p,uVar12);
          if (iVar4 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                          ,0x2e7,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
          }
          iVar4 = Gia_ObjFromMiniFanin0Copy(pGVar11,p_01,p,uVar12);
          iVar6 = Gia_ObjFromMiniFanin1Copy(pGVar11,p_01,p,uVar12);
          iVar4 = Gia_ManHashAnd(p_00,iVar4,iVar6);
        }
        else {
          iVar5 = iVar5 + 1;
          iVar4 = -1;
        }
      }
      else {
        pGVar10 = Gia_ManAppendObj(p_00);
        uVar15 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar15 | 0x9fffffff;
        *(ulong *)pGVar10 =
             uVar15 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar1 = p_00->pObjs;
        if ((pGVar10 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar10)) {
LAB_007829a5:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar1) >> 2) * -0x55555555);
        pGVar1 = p_00->pObjs;
        if ((pGVar10 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar10)) goto LAB_007829a5;
        iVar4 = (int)((ulong)((long)pGVar10 - (long)pGVar1) >> 2) * 0x55555556;
      }
      Vec_IntPush(p_01,iVar4);
      uVar12 = uVar12 + 1;
    } while (uVar3 != uVar12);
  }
  if (p_01->nSize != uVar14) {
    __assert_fail("Vec_IntSize(vCopies) == nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x2ea,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
  }
  if (iVar5 <= p->nRegs) {
    __assert_fail("nPos > Mini_AigRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x2eb,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
  }
  if (iVar7 < 4) {
    iVar4 = p_00->vCos->nSize;
    iVar6 = 0;
  }
  else {
    uVar15 = 2;
    if (2 < (int)uVar14) {
      uVar15 = (ulong)uVar14;
    }
    uVar13 = 1;
    do {
      uVar3 = pEquivs[uVar13];
      if (uVar3 != 0xffffffff) {
        if (uVar14 <= uVar13) {
LAB_007829c4:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((int)uVar3 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (uVar14 <= uVar3 >> 1) goto LAB_007829c4;
        uVar12 = p_01->pArray[uVar3 >> 1];
        if ((int)uVar12 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar4 = Gia_ManHashXor(p_00,p_01->pArray[uVar13],uVar12 ^ uVar3 & 1);
        Gia_ManAppendCo(p_00,iVar4);
      }
      uVar13 = uVar13 + 1;
    } while (uVar15 != uVar13);
    iVar6 = 0;
    iVar4 = p_00->vCos->nSize;
    if (3 < iVar7) {
      uVar3 = 2;
      if (2 < (int)uVar14) {
        uVar3 = uVar14;
      }
      uVar14 = 1;
      iVar6 = 0;
      do {
        pGVar11 = (Gia_Man_t *)p;
        iVar7 = Mini_AigNodeIsPo(p,uVar14);
        if ((iVar7 != 0) &&
           (iVar7 = iVar6 + 1, bVar2 = iVar5 - p->nRegs <= iVar6, iVar6 = iVar7, bVar2)) {
          iVar7 = Gia_ObjFromMiniFanin0Copy(pGVar11,p_01,p,uVar14);
          Gia_ManAppendCo(p_00,iVar7);
        }
        uVar14 = uVar14 + 1;
      } while (uVar3 != uVar14);
    }
  }
  if (iVar6 != iVar5) {
    __assert_fail("iPos == nPos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x2fe,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
  }
  if (p->nRegs != p_00->vCos->nSize - iVar4) {
    __assert_fail("Mini_AigRegNum(p) == Gia_ManCoNum(pGia) - Temp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x2ff,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  Gia_ManHashStop(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  pGVar11 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar11;
}

Assistant:

Gia_Man_t * Gia_MiniAigMiter( Mini_Aig_t * p, int * pEquivs )
{
    Gia_Man_t * pGia, * pTemp;
    Vec_Int_t * vCopies;
    int i, iGiaLit = 0, iGiaLit2, nNodes, iPos = 0, nPos = 0, Temp;
    // get the number of nodes
    nNodes = Mini_AigNodeNum(p);
    // create ABC network
    pGia = Gia_ManStart( 2 * nNodes );
    pGia->pName = Abc_UtilStrsav( "MiniAig" );
    // create mapping from MiniAIG objects into ABC objects
    vCopies = Vec_IntAlloc( nNodes );
    Vec_IntPush( vCopies, 0 );
    // iterate through the objects
    Gia_ManHashAlloc( pGia );
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
            iGiaLit = Gia_ManAppendCi(pGia);
        else if ( Mini_AigNodeIsPo( p, i ) )
        {
            nPos++;
            Vec_IntPush( vCopies, -1 );
            continue;
        }
        else if ( Mini_AigNodeIsAnd( p, i ) )
            iGiaLit = Gia_ManHashAnd(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i), Gia_ObjFromMiniFanin1Copy(pGia, vCopies, p, i));
        else assert( 0 );
        Vec_IntPush( vCopies, iGiaLit );
    }
    assert( Vec_IntSize(vCopies) == nNodes );
    assert( nPos > Mini_AigRegNum(p) );
    // create miters for each equiv class
    for ( i = 1; i < nNodes; i++ )
    {
        if ( pEquivs[i] == -1 )
            continue;
        iGiaLit = Vec_IntEntry(vCopies, i);
        iGiaLit2 = Abc_LitNotCond( Vec_IntEntry(vCopies, Abc_Lit2Var(pEquivs[i])), Abc_LitIsCompl(pEquivs[i]) );
        Gia_ManAppendCo( pGia, Gia_ManHashXor(pGia, iGiaLit, iGiaLit2) );
    }
    // create flop inputs
    Temp = Gia_ManCoNum(pGia);
    for ( i = 1; i < nNodes; i++ )
    {
        if ( !Mini_AigNodeIsPo( p, i ) )
            continue;
        if ( iPos++ >= nPos - Mini_AigRegNum(p) )
            Gia_ManAppendCo(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i));
    }
    assert( iPos == nPos );
    assert( Mini_AigRegNum(p) == Gia_ManCoNum(pGia) - Temp );
    Gia_ManSetRegNum( pGia, Mini_AigRegNum(p) );
    Gia_ManHashStop( pGia );
    Vec_IntFree( vCopies );
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return pGia;
}